

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ModSystem.cpp
# Opt level: O0

void __thiscall
AddIRCCommand::trigger
          (AddIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  const_reference pvVar6;
  size_type sVar7;
  ulong uVar8;
  ulong uVar9;
  Server *server_00;
  PlayerInfo *player_00;
  size_type sVar10;
  char *pcVar11;
  size_type sVar12;
  char *pcVar13;
  basic_string_view<char,_std::char_traits<char>_> *pbVar14;
  size_t sVar15;
  char *pcVar16;
  basic_string_view<char,_std::char_traits<char>_> bVar17;
  size_t local_2a8;
  char *local_2a0;
  string local_288;
  __sv_type local_268;
  size_t local_258;
  char *pcStack_250;
  string local_238;
  __sv_type local_218;
  size_t local_208;
  char *pcStack_200;
  basic_string_view<char,_std::char_traits<char>_> local_1f0;
  size_t local_1e0;
  char *local_1d8;
  basic_string_view<char,_std::char_traits<char>_> local_1d0;
  size_t local_1c0;
  char *local_1b8;
  basic_string_view<char,_std::char_traits<char>_> local_1b0;
  size_t local_1a0;
  char *local_198;
  char *local_190;
  size_t local_188;
  uint local_17c;
  undefined1 auStack_178 [4];
  uint i;
  char *local_170;
  size_t local_168;
  char *local_160;
  basic_string_view<char,_std::char_traits<char>_> local_158;
  size_t local_148;
  char *local_140;
  Jupiter *local_138;
  size_t local_130;
  int local_124;
  undefined1 local_120 [4];
  int index;
  size_t local_110;
  char *local_108;
  undefined1 local_100 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  parameters_split_1;
  string_view playerName;
  bool serverMatch;
  ModGroup *pMStack_c8;
  int type;
  ModGroup *group;
  PlayerInfo *player;
  Server *server;
  Channel *chan;
  char *local_90;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  size_t local_68;
  char *local_60;
  undefined1 local_58 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  parameters_split;
  IRC_Bot *source_local;
  AddIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  pcVar16 = nick._M_str;
  sVar15 = nick._M_len;
  local_68 = parameters._M_len;
  local_60 = parameters._M_str;
  pbVar14 = (basic_string_view<char,_std::char_traits<char>_> *)parameters._M_len;
  parameters_split.second._M_str = (char *)source;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78," \t");
  jessilib::
  word_split_once_view<,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)local_58,(jessilib *)&local_68,&local_78,pbVar14);
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     &parameters_split.first._M_str);
  pcVar1 = parameters_split.second._M_str;
  if (bVar2) {
    bVar17 = sv("Error: Too few parameters. Syntax: add <level> <player>",0x37);
    chan = (Channel *)bVar17._M_len;
    local_90 = bVar17._M_str;
    Jupiter::IRC::Client::sendNotice(pcVar1,sVar15,pcVar16,chan,local_90);
  }
  else {
    lVar5 = Jupiter::IRC::Client::getChannel
                      (parameters_split.second._M_str,channel._M_len,channel._M_str);
    if (lVar5 != 0) {
      pMStack_c8 = (ModGroup *)0x0;
      Jupiter::IRC::Client::Channel::getType();
      bVar2 = false;
      parameters_split_1.second._M_str = (char *)parameters._M_len;
      playerName._M_len = (size_t)parameters._M_str;
      pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&parameters,0);
      iVar4 = isdigit((int)*pvVar6);
      if (iVar4 != 0) {
        local_110 = parameters._M_len;
        local_108 = parameters._M_str;
        pbVar14 = (basic_string_view<char,_std::char_traits<char>_> *)parameters._M_len;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)local_120," \t");
        jessilib::
        word_split_once_view<,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                  ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *)local_100,(jessilib *)&local_110,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_120,pbVar14);
        local_138 = (Jupiter *)local_100;
        local_130 = parameters_split_1.first._M_len;
        bVar17._M_str = (char *)0x0;
        bVar17._M_len = parameters_split_1.first._M_len;
        iVar4 = Jupiter::asInt<char>((Jupiter *)local_100,bVar17,(int)pbVar14);
        local_124 = iVar4;
        if ((iVar4 < 0) ||
           (sVar7 = std::__cxx11::
                    list<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
                    ::size(&pluginInstance.groups), (int)sVar7 <= iVar4)) {
          pcVar1 = parameters_split.second._M_str;
          local_148 = sVar15;
          local_140 = pcVar16;
          local_158 = sv("Error: Invalid group index.",0x1b);
          Jupiter::IRC::Client::sendNotice
                    (pcVar1,local_148,local_140,local_158._M_len,local_158._M_str);
        }
        else {
          pMStack_c8 = RenX_ModSystemPlugin::getGroupByIndex(&pluginInstance,(long)local_124);
          parameters_split_1.second._M_str = parameters_split_1.first._M_str;
          playerName._M_len = parameters_split_1.second._M_len;
        }
      }
      pcVar1 = parameters_split.second._M_str;
      if (pMStack_c8 == (ModGroup *)0x0) {
        local_168 = sVar15;
        local_160 = pcVar16;
        _auStack_178 = sv("Error: Invalid group.",0x15);
        Jupiter::IRC::Client::sendNotice(pcVar1,local_168,local_160,_auStack_178,local_170);
      }
      else {
        local_17c = 0;
        while( true ) {
          uVar9 = (ulong)local_17c;
          RenX::getCore();
          uVar8 = RenX::Core::getServerCount();
          pcVar1 = parameters_split.second._M_str;
          if (uVar9 == uVar8) break;
          uVar9 = RenX::getCore();
          server_00 = (Server *)RenX::Core::getServer(uVar9);
          uVar9 = RenX::Server::isLogChanType((int)server_00);
          if ((uVar9 & 1) != 0) {
            bVar2 = true;
            local_190 = parameters_split_1.second._M_str;
            local_188 = playerName._M_len;
            player_00 = (PlayerInfo *)
                        RenX::Server::getPlayerByPartName
                                  (server_00,parameters_split_1.second._M_str,playerName._M_len);
            pcVar1 = parameters_split.second._M_str;
            if (player_00 == (PlayerInfo *)0x0) {
              local_1a0 = sVar15;
              local_198 = pcVar16;
              local_1b0 = sv("Error: Player not found.",0x18);
              Jupiter::IRC::Client::sendNotice
                        (pcVar1,local_1a0,local_198,local_1b0._M_len,local_1b0._M_str);
            }
            else if ((player_00->isBot & 1U) == 0) {
              bVar3 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                (&player_00->uuid);
              pcVar1 = parameters_split.second._M_str;
              if (bVar3) {
                local_1e0 = sVar15;
                local_1d8 = pcVar16;
                local_1f0 = sv("Error: Player has no UUID.",0x1a);
                Jupiter::IRC::Client::sendNotice
                          (pcVar1,local_1e0,local_1d8,local_1f0._M_len,local_1f0._M_str);
              }
              else {
                RenX_ModSystemPlugin::resetAccess(&pluginInstance,player_00);
                bVar3 = RenX_ModSystemPlugin::set(&pluginInstance,player_00,pMStack_c8);
                pcVar1 = parameters_split.second._M_str;
                if (bVar3) {
                  local_208 = sVar15;
                  pcStack_200 = pcVar16;
                  sVar10 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                     (&player_00->name);
                  pcVar11 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                                      (&player_00->name);
                  sVar12 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                     (&pMStack_c8->name);
                  pcVar13 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                                      (&pMStack_c8->name);
                  string_printf_abi_cxx11_
                            (&local_238,"%.*s has been added to group \"%.*s\"",sVar10,pcVar11,
                             sVar12,pcVar13);
                  local_218 = std::__cxx11::string::operator_cast_to_basic_string_view
                                        ((string *)&local_238);
                  Jupiter::IRC::Client::sendNotice
                            (pcVar1,local_208,pcStack_200,local_218._M_len,local_218._M_str);
                  std::__cxx11::string::~string((string *)&local_238);
                }
                else {
                  local_258 = sVar15;
                  pcStack_250 = pcVar16;
                  sVar10 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                     (&player_00->name);
                  pcVar11 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                                      (&player_00->name);
                  sVar12 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                     (&pMStack_c8->name);
                  pcVar13 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                                      (&pMStack_c8->name);
                  string_printf_abi_cxx11_
                            (&local_288,"%.*s has been moved to group \"%.*s\"",sVar10,pcVar11,
                             sVar12,pcVar13);
                  local_268 = std::__cxx11::string::operator_cast_to_basic_string_view
                                        ((string *)&local_288);
                  Jupiter::IRC::Client::sendNotice
                            (pcVar1,local_258,pcStack_250,local_268._M_len,local_268._M_str);
                  std::__cxx11::string::~string((string *)&local_288);
                }
                RenX_ModSystemPlugin::auth(&pluginInstance,server_00,player_00,false,true);
              }
            }
            else {
              local_1c0 = sVar15;
              local_1b8 = pcVar16;
              local_1d0 = sv("Error: A bot can not be a moderator.",0x24);
              Jupiter::IRC::Client::sendNotice
                        (pcVar1,local_1c0,local_1b8,local_1d0._M_len,local_1d0._M_str);
            }
          }
          local_17c = local_17c + 1;
        }
        if (!bVar2) {
          bVar17 = sv("Error: Channel not attached to any connected Renegade X servers.",0x40);
          local_2a8 = bVar17._M_len;
          local_2a0 = bVar17._M_str;
          Jupiter::IRC::Client::sendMessage
                    (pcVar1,channel._M_len,channel._M_str,local_2a8,local_2a0);
        }
      }
    }
  }
  return;
}

Assistant:

void AddIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	auto parameters_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (parameters_split.second.empty()) {
		source->sendNotice(nick, "Error: Too few parameters. Syntax: add <level> <player>"sv);
		return;
	}

	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr) {
		RenX::Server *server;
		RenX::PlayerInfo *player;
		RenX_ModSystemPlugin::ModGroup *group = nullptr;
		int type = chan->getType();
		bool serverMatch = false;
		std::string_view playerName = parameters;
		if (isdigit(parameters[0])) {
			auto parameters_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
			int index = Jupiter::asInt(parameters_split.first);

			if (index < 0 || index >= static_cast<int>(pluginInstance.groups.size())) {
				source->sendNotice(nick, "Error: Invalid group index."sv);
			}
			else {
				group = pluginInstance.getGroupByIndex(index);
				playerName = parameters_split.second;
			}
		}
		if (group == nullptr)
			source->sendNotice(nick, "Error: Invalid group."sv);
		else {
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++) {
				server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type)) {
					serverMatch = true;
					player = server->getPlayerByPartName(playerName);
					if (player == nullptr)
						source->sendNotice(nick, "Error: Player not found."sv);
					else if (player->isBot)
						source->sendNotice(nick, "Error: A bot can not be a moderator."sv);
					else if (player->uuid.empty())
						source->sendNotice(nick, "Error: Player has no UUID."sv);
					else {
						pluginInstance.resetAccess(*player);
						if (pluginInstance.set(*player, *group))
							source->sendNotice(nick, string_printf("%.*s has been added to group \"%.*s\"", player->name.size(), player->name.data(), group->name.size(), group->name.data()));
						else
							source->sendNotice(nick, string_printf("%.*s has been moved to group \"%.*s\"", player->name.size(), player->name.data(), group->name.size(), group->name.data()));
						pluginInstance.auth(*server, *player, false, true);
					}
				}
			}
			if (serverMatch == false)
				source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		}
	}
}